

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_helper.c
# Opt level: O2

uint32_t helper_v7m_tt_arm(CPUARMState *env,uint32_t addr,uint32_t op)

{
  byte bVar1;
  int iVar2;
  ARMMMUIdx AVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  ARMMMUIdx mmu_idx;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint32_t uVar10;
  uint32_t mregion;
  _Bool is_subpage;
  uint32_t local_6c;
  MemTxAttrs attrs;
  int prot;
  V8M_SAttributes sattrs;
  ARMMMUFaultInfo fi;
  hwaddr phys_addr;
  
  sattrs.srvalid = false;
  sattrs.iregion = '\0';
  sattrs.irvalid = false;
  sattrs.subpage = false;
  sattrs.ns = false;
  sattrs.nsc = false;
  sattrs.sregion = '\0';
  fi.stage2 = false;
  fi.s1ptw = false;
  fi.ea = false;
  fi._19_1_ = 0;
  attrs = (MemTxAttrs)0x0;
  fi.type = ARMFault_None;
  fi.s2addr = 0;
  fi.level = 0;
  fi.domain = 0;
  uVar10 = (env->v7m).secure;
  bVar1 = uVar10 != 0 ^ (byte)((op & 2) >> 1);
  AVar3 = ARMMMUIdx_MUser;
  if (((op & 1) == 0) && (((env->v7m).exception != 0 || (((env->v7m).control[bVar1] & 1) == 0)))) {
    AVar3 = ARMMMUIdx_MPriv;
  }
  mmu_idx = AVar3 | 4;
  if (bVar1 == 0) {
    mmu_idx = AVar3;
  }
  iVar2 = arm_current_el(env);
  local_6c = addr;
  if (iVar2 == 0 && (op & 2) == 0) {
    mregion = 0;
    uVar9 = 0;
    uVar8 = 0;
    uVar6 = 0;
  }
  else {
    pmsav8_mpu_lookup_arm
              (env,addr,MMU_DATA_LOAD,mmu_idx,&phys_addr,&attrs,&prot,&is_subpage,
               (ARMMMUFaultInfo_conflict *)&fi,&mregion);
    uVar8 = 0x10000;
    if (mregion == 0xffffffff) {
      mregion = 0;
      uVar8 = 0;
    }
    uVar9 = (prot & 2U) >> 1;
    uVar10 = (env->v7m).secure;
    uVar6 = prot;
  }
  if (uVar10 == 0) {
    uVar7 = 0;
    uVar5 = 0;
    uVar4 = 0;
  }
  else {
    v8m_security_lookup_arm(env,local_6c,MMU_DATA_LOAD,mmu_idx,&sattrs);
    uVar4 = (sattrs.ns ^ 1) << 0x16 | (uint)sattrs.irvalid << 0x17 | (uint)sattrs.iregion << 0x18 |
            (uint)(sattrs.ns & (byte)uVar9) << 0x15 | (uint)(sattrs.ns & (byte)uVar6) << 0x14;
    uVar5 = (uint)sattrs.srvalid << 0x11;
    uVar7 = (uint)sattrs.sregion << 8;
  }
  return (uVar6 & 1) << 0x12 | uVar9 << 0x13 | uVar4 | uVar5 | uVar8 | mregion | uVar7;
}

Assistant:

uint32_t HELPER(v7m_tt)(CPUARMState *env, uint32_t addr, uint32_t op)
{
    /* Implement the TT instruction. op is bits [7:6] of the insn. */
    bool forceunpriv = op & 1;
    bool alt = op & 2;
    V8M_SAttributes sattrs = { 0 };
    uint32_t tt_resp;
    bool r, rw, nsr, nsrw, mrvalid;
    int prot;
    ARMMMUFaultInfo fi = { 0 };
    MemTxAttrs attrs = { 0 };
    hwaddr phys_addr;
    ARMMMUIdx mmu_idx;
    uint32_t mregion;
    bool targetpriv;
    bool targetsec = env->v7m.secure;
    bool is_subpage;

    /*
     * Work out what the security state and privilege level we're
     * interested in is...
     */
    if (alt) {
        targetsec = !targetsec;
    }

    if (forceunpriv) {
        targetpriv = false;
    } else {
        targetpriv = arm_v7m_is_handler_mode(env) ||
            !(env->v7m.control[targetsec] & R_V7M_CONTROL_NPRIV_MASK);
    }

    /* ...and then figure out which MMU index this is */
    mmu_idx = arm_v7m_mmu_idx_for_secstate_and_priv(env, targetsec, targetpriv);

    /*
     * We know that the MPU and SAU don't care about the access type
     * for our purposes beyond that we don't want to claim to be
     * an insn fetch, so we arbitrarily call this a read.
     */

    /*
     * MPU region info only available for privileged or if
     * inspecting the other MPU state.
     */
    if (arm_current_el(env) != 0 || alt) {
        /* We can ignore the return value as prot is always set */
        pmsav8_mpu_lookup(env, addr, MMU_DATA_LOAD, mmu_idx,
                          &phys_addr, &attrs, &prot, &is_subpage,
                          &fi, &mregion);
        if (mregion == -1) {
            mrvalid = false;
            mregion = 0;
        } else {
            mrvalid = true;
        }
        r = prot & PAGE_READ;
        rw = prot & PAGE_WRITE;
    } else {
        r = false;
        rw = false;
        mrvalid = false;
        mregion = 0;
    }

    if (env->v7m.secure) {
        v8m_security_lookup(env, addr, MMU_DATA_LOAD, mmu_idx, &sattrs);
        nsr = sattrs.ns && r;
        nsrw = sattrs.ns && rw;
    } else {
        sattrs.ns = true;
        nsr = false;
        nsrw = false;
    }

    tt_resp = (sattrs.iregion << 24) |
        (sattrs.irvalid << 23) |
        ((!sattrs.ns) << 22) |
        (nsrw << 21) |
        (nsr << 20) |
        (rw << 19) |
        (r << 18) |
        (sattrs.srvalid << 17) |
        (mrvalid << 16) |
        (sattrs.sregion << 8) |
        mregion;

    return tt_resp;
}